

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsKeyPressed(ImGuiKey key,bool repeat)

{
  float *pfVar1;
  float fVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  ImGuiKeyData *pIVar5;
  float t;
  ImGuiKeyData *key_data;
  ImGuiContext *g;
  bool repeat_local;
  ImGuiKey key_local;
  
  pIVar3 = GImGui;
  pIVar5 = GetKeyData(key);
  fVar2 = pIVar5->DownDuration;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    if ((!repeat) || (pfVar1 = &(pIVar3->IO).KeyRepeatDelay, fVar2 < *pfVar1 || fVar2 == *pfVar1)) {
      repeat_local = false;
    }
    else {
      iVar4 = GetKeyPressedAmount(key,(pIVar3->IO).KeyRepeatDelay,(pIVar3->IO).KeyRepeatRate);
      repeat_local = 0 < iVar4;
    }
  }
  else {
    repeat_local = true;
  }
  return repeat_local;
}

Assistant:

bool ImGui::IsKeyPressed(ImGuiKey key, bool repeat)
{
    ImGuiContext& g = *GImGui;
    const ImGuiKeyData* key_data = GetKeyData(key);
    const float t = key_data->DownDuration;
    if (t == 0.0f)
        return true;
    if (repeat && t > g.IO.KeyRepeatDelay)
        return GetKeyPressedAmount(key, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0;
    return false;
}